

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::combineAnd(OptimizeInstructions *this,Binary *curr)

{
  UnaryOp UVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  ulong uVar4;
  char *pcVar5;
  Const *pCVar6;
  bool bVar7;
  bool bVar8;
  UnaryOp UVar9;
  BinaryOp BVar10;
  Binary *pBVar11;
  Binary *pBVar12;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_e8;
  Literal local_b8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_90;
  uintptr_t local_60;
  OptimizeInstructions *local_58;
  HeapType local_50;
  Const *cy;
  Const *cx;
  undefined1 local_31;
  
  local_58 = this;
  if (curr->op != AndInt32) {
    __assert_fail("curr->op == AndInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xda5,"Expression *wasm::OptimizeInstructions::combineAnd(Binary *)");
  }
  pBVar12 = (Binary *)curr->left;
  bVar7 = true;
  if ((((pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
        UnaryId) &&
      (UVar1 = pBVar12->op,
      UVar9 = Match::Internal::AbstractUnaryOpK::getOp((Type)(pBVar12->left->type).id,EqZ),
      UVar1 == UVar9)) && (pEVar2 = curr->right, pEVar2->_id == UnaryId)) {
    pEVar3 = pBVar12->left;
    UVar1 = *(UnaryOp *)(pEVar2 + 1);
    pBVar12 = (Binary *)(ulong)UVar1;
    UVar9 = Match::Internal::AbstractUnaryOpK::getOp
                      ((Type)*(uintptr_t *)(pEVar2[1].type.id + 8),EqZ);
    if (UVar1 == UVar9) {
      pEVar2 = (Expression *)pEVar2[1].type.id;
      uVar4 = (pEVar3->type).id;
      if (uVar4 == (pEVar2->type).id) {
        pBVar12 = (Binary *)curr->left;
        if ((pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id !=
            UnaryId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Unary]");
        }
        if (6 < uVar4) {
          __assert_fail("isBasic() && \"Basic type expected\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x1c4,"BasicType wasm::Type::getBasic() const");
        }
        cx = (Const *)CONCAT44(cx._4_4_,*(undefined4 *)(&DAT_00e16548 + uVar4 * 4));
        pBVar11 = (Binary *)
                  MixedArena::allocSpace
                            (&((local_58->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .currModule)->allocator,0x28,8);
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar11->op = (BinaryOp)cx;
        pBVar11->left = pEVar3;
        pBVar11->right = pEVar2;
        Binary::finalize(pBVar11);
        pBVar12->left = (Expression *)pBVar11;
        bVar7 = false;
      }
    }
  }
  if (!bVar7) {
    return (Expression *)pBVar12;
  }
  pBVar11 = (Binary *)curr->left;
  local_e8.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_e8.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  if (((pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
       BinaryId) &&
     (cy = (Const *)pBVar11->right,
     (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)) {
    cx = (Const *)pBVar11->left;
    Literal::Literal((Literal *)&local_a0.func,&cy->value);
    bVar7 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&local_e8,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_a0.func);
    Literal::~Literal((Literal *)&local_a0.func);
    if (bVar7) {
      pEVar2 = curr->right;
      local_90.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_90.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
      local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_50;
      if ((pEVar2->_id == BinaryId) && (pcVar5 = *(char **)(pEVar2 + 2), *pcVar5 == '\x0e')) {
        local_60 = pEVar2[1].type.id;
        local_50.id = (uintptr_t)pcVar5;
        Literal::Literal(&local_b8,(Literal *)(pcVar5 + 0x10));
        local_31 = Match::Internal::
                   Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                   ::matches(&local_90,&local_b8);
        Literal::~Literal(&local_b8);
        if ((local_31 != '\0') &&
           (((pBVar11->op == *(BinaryOp *)(pEVar2 + 1) &&
             ((cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id ==
              *(uintptr_t *)(local_60 + 8))) &&
            (bVar7 = Literal::operator==(&cy->value,(Literal *)(local_50.id + 0x10)), bVar7)))) {
          bVar8 = inversesAnd(local_58,pBVar11);
          pCVar6 = cx;
          bVar7 = true;
          if (bVar8) {
            BVar10 = Abstract::getBinary((Type)(cx->
                                               super_SpecificExpression<(wasm::Expression::Id)14>).
                                               super_Expression.type.id,Or);
            *(BinaryOp *)(pEVar2 + 1) = BVar10;
            (pEVar2->type).id =
                 (pCVar6->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                 id;
            pEVar2[1].type.id = (uintptr_t)pCVar6;
            *(uintptr_t *)(pEVar2 + 2) = local_60;
            pBVar11->left = pEVar2;
            bVar7 = false;
            pBVar12 = pBVar11;
          }
          goto LAB_009ea538;
        }
      }
    }
  }
  bVar7 = true;
LAB_009ea538:
  if (bVar7) {
    pBVar12 = (Binary *)curr->left;
    local_e8.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_e8.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) &&
       (cy = (Const *)pBVar12->right,
       (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)) {
      pEVar2 = pBVar12->left;
      Literal::Literal((Literal *)&local_a0.func,&cy->value);
      bVar7 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&local_e8,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_a0.func);
      Literal::~Literal((Literal *)&local_a0.func);
      if (bVar7) {
        pEVar3 = curr->right;
        local_90.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_90.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_50;
        if ((pEVar3->_id == BinaryId) &&
           (local_50.id = *(uintptr_t *)(pEVar3 + 2), *(char *)local_50.id == '\x0e')) {
          cx = (Const *)pEVar3[1].type.id;
          Literal::Literal(&local_b8,(Literal *)(local_50.id + 0x10));
          bVar7 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&local_90,&local_b8);
          Literal::~Literal(&local_b8);
          if ((bVar7) &&
             ((((pBVar12->op == *(BinaryOp *)(pEVar3 + 1) &&
                ((pEVar2->type).id ==
                 (cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
               && (bVar7 = Literal::operator==(&cy->value,(Literal *)(local_50.id + 0x10)), bVar7))
              && (bVar7 = preserveAnd(local_58,pBVar12), bVar7)))) {
            BVar10 = Abstract::getBinary((Type)(pEVar2->type).id,And);
            *(BinaryOp *)(pEVar3 + 1) = BVar10;
            (pEVar3->type).id = (pEVar2->type).id;
            pEVar3[1].type.id = (uintptr_t)pEVar2;
            *(Const **)(pEVar3 + 2) = cx;
            pBVar12->left = pEVar3;
            return (Expression *)pBVar12;
          }
        }
      }
    }
    pBVar12 = (Binary *)0x0;
  }
  return (Expression *)pBVar12;
}

Assistant:

Expression* combineAnd(Binary* curr) {
    assert(curr->op == AndInt32);

    using namespace Abstract;
    using namespace Match;

    {
      // (i32(x) == 0) & (i32(y) == 0)   ==>   i32(x | y) == 0
      // (i64(x) == 0) & (i64(y) == 0)   ==>   i64(x | y) == 0
      Expression *x, *y;
      if (matches(curr->left, unary(EqZ, any(&x))) &&
          matches(curr->right, unary(EqZ, any(&y))) && x->type == y->type) {
        auto* inner = curr->left->cast<Unary>();
        inner->value =
          Builder(*getModule()).makeBinary(getBinary(x->type, Or), x, y);
        return inner;
      }
    }
    {
      // Binary operations that inverse a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesAnd(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveAnd(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }